

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode Curl_protocol_connect(connectdata *conn,_Bool *protocol_done)

{
  undefined1 *puVar1;
  uint uVar2;
  _func_CURLcode_connectdata_ptr__Bool_ptr *p_Var3;
  _Bool _Var4;
  CURLcode CVar5;
  
  *protocol_done = false;
  uVar2 = *(uint *)&(conn->bits).field_0x4;
  if (((byte)(uVar2 >> 0xc) & 1 & (conn->bits).tcpconnect[0]) == 1) {
    if (conn->handler->connecting == (_func_CURLcode_connectdata_ptr__Bool_ptr *)0x0) {
      *protocol_done = true;
    }
  }
  else if ((uVar2 >> 0xc & 1) == 0) {
    CVar5 = Curl_proxy_connect(conn,0);
    if (CVar5 != CURLE_OK) {
      return CVar5;
    }
    if ((((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
        ((conn->bits).proxy_ssl_connected[0] == true)) &&
       (((~*(uint *)&(conn->bits).field_0x4 & 0x4020) != 0 ||
        (_Var4 = Curl_connect_ongoing(conn), !_Var4)))) {
      p_Var3 = conn->handler->connect_it;
      if (p_Var3 == (_func_CURLcode_connectdata_ptr__Bool_ptr *)0x0) {
        *protocol_done = true;
      }
      else {
        CVar5 = (*p_Var3)(conn,protocol_done);
        if (CVar5 != CURLE_OK) {
          return CVar5;
        }
      }
      puVar1 = &(conn->bits).field_0x5;
      *puVar1 = *puVar1 | 0x10;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_protocol_connect(struct connectdata *conn,
                               bool *protocol_done)
{
  CURLcode result = CURLE_OK;

  *protocol_done = FALSE;

  if(conn->bits.tcpconnect[FIRSTSOCKET] && conn->bits.protoconnstart) {
    /* We already are connected, get back. This may happen when the connect
       worked fine in the first call, like when we connect to a local server
       or proxy. Note that we don't know if the protocol is actually done.

       Unless this protocol doesn't have any protocol-connect callback, as
       then we know we're done. */
    if(!conn->handler->connecting)
      *protocol_done = TRUE;

    return CURLE_OK;
  }

  if(!conn->bits.protoconnstart) {

    result = Curl_proxy_connect(conn, FIRSTSOCKET);
    if(result)
      return result;

    if(CONNECT_FIRSTSOCKET_PROXY_SSL())
      /* wait for HTTPS proxy SSL initialization to complete */
      return CURLE_OK;

    if(conn->bits.tunnel_proxy && conn->bits.httpproxy &&
       Curl_connect_ongoing(conn))
      /* when using an HTTP tunnel proxy, await complete tunnel establishment
         before proceeding further. Return CURLE_OK so we'll be called again */
      return CURLE_OK;

    if(conn->handler->connect_it) {
      /* is there a protocol-specific connect() procedure? */

      /* Call the protocol-specific connect function */
      result = conn->handler->connect_it(conn, protocol_done);
    }
    else
      *protocol_done = TRUE;

    /* it has started, possibly even completed but that knowledge isn't stored
       in this bit! */
    if(!result)
      conn->bits.protoconnstart = TRUE;
  }

  return result; /* pass back status */
}